

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_not_mtsafe_st_env_infrastructure.cpp
# Opt level: O0

void __thiscall
so_5::env_infrastructures::simple_not_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>::
try_handle_next_demand
          (env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>
           *this)

{
  pop_result_t pVar1;
  uint uVar2;
  int iVar3;
  pointer ptVar4;
  undefined4 extraout_var;
  anon_class_8_1_8991fb9c_for_m_lambda_conflict local_88;
  at_exit_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sigman78[P]sobjectizer_so_5_rt_impl_simple_not_mtsafe_st_env_infrastructure_cpp:631:7)>
  local_80;
  at_exit_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sigman78[P]sobjectizer_so_5_rt_impl_simple_not_mtsafe_st_env_infrastructure_cpp:631:7)>
  work_tracking_stopper;
  duration<long,_std::ratio<3600L,_1L>_> local_70;
  undefined8 local_68;
  duration<long,_std::ratio<1L,_1000000000L>_> local_60;
  duration sleep_time;
  undefined1 local_40 [4];
  pop_result_t pop_result;
  execution_demand_t demand;
  env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>
  *this_local;
  
  demand.m_demand_handler = (demand_handler_pfn_t)this;
  execution_demand_t::execution_demand_t((execution_demand_t *)local_40);
  pVar1 = event_queue_impl_t::pop(&this->m_event_queue,(execution_demand_t *)local_40);
  if (pVar1 == empty_queue) {
    ptVar4 = std::unique_ptr<so_5::timer_manager_t,_std::default_delete<so_5::timer_manager_t>_>::
             operator->(&this->m_timer_manager);
    uVar2 = (*ptVar4->_vptr_timer_manager_t[6])();
    if ((uVar2 & 1) == 0) {
      st_reusable_stuff::fake_activity_tracker_t::wait_start_if_not_started
                ((fake_activity_tracker_t *)&this->field_0x1a8);
      ptVar4 = std::unique_ptr<so_5::timer_manager_t,_std::default_delete<so_5::timer_manager_t>_>::
               operator->(&this->m_timer_manager);
      work_tracking_stopper.m_lambda.this._4_4_ = 0x18;
      std::chrono::duration<long,std::ratio<3600l,1l>>::duration<int,void>
                ((duration<long,std::ratio<3600l,1l>> *)&local_70,
                 (int *)((long)&work_tracking_stopper.m_lambda.this + 4));
      std::chrono::duration<long,std::ratio<1l,1000000000l>>::
      duration<long,std::ratio<3600l,1l>,void>
                ((duration<long,std::ratio<1l,1000000000l>> *)&local_68,&local_70);
      iVar3 = (*ptVar4->_vptr_timer_manager_t[3])(ptVar4,local_68);
      local_60.__r = CONCAT44(extraout_var,iVar3);
      std::this_thread::sleep_for<long,std::ratio<1l,1000000000l>>(&local_60);
    }
    else {
      (*(this->super_environment_infrastructure_t)._vptr_environment_infrastructure_t[3])();
    }
  }
  else {
    st_reusable_stuff::fake_activity_tracker_t::wait_stopped
              ((fake_activity_tracker_t *)&this->field_0x1a8);
    st_reusable_stuff::fake_activity_tracker_t::work_started
              ((fake_activity_tracker_t *)&this->field_0x1a8);
    local_88.this = this;
    details::
    at_scope_exit<so_5::env_infrastructures::simple_not_mtsafe::impl::env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>::try_handle_next_demand()::_lambda()_1_>
              ((details *)&local_80,&local_88);
    st_reusable_stuff::
    default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>
    ::handle_demand(&(this->m_default_disp).
                     super_default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>
                    ,(execution_demand_t *)local_40);
    details::scope_exit_details::
    at_exit_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sigman78[P]sobjectizer/so_5/rt/impl/simple_not_mtsafe_st_env_infrastructure.cpp:631:7)>
    ::~at_exit_t(&local_80);
  }
  execution_demand_t::~execution_demand_t((execution_demand_t *)local_40);
  return;
}

Assistant:

void
env_infrastructure_t< ACTIVITY_TRACKER >::try_handle_next_demand()
	{
		execution_demand_t demand;
		const auto pop_result = m_event_queue.pop( demand );
		// If there is no demands we must go to sleep for some time...
		if( event_queue_impl_t::pop_result_t::empty_queue == pop_result )
			{
				// We must try to sleep for next timer but only if
				// there is any timer.
				if( !m_timer_manager->empty() )
					{
						// Tracking time for 'waiting' state must be turned on.
						m_activity_tracker.wait_start_if_not_started();

						const auto sleep_time =
								m_timer_manager->timeout_before_nearest_timer(
										// We can use very large value here.
										std::chrono::hours(24) );

						std::this_thread::sleep_for( sleep_time );
					}
				else
					// There are no demands and there are no timers.
					// Environment's work must be finished.
					stop();
			}
		else
			{
				// Tracking time for 'waiting' must be turned off, but
				// tracking time for 'working' must be tuned on and then off again.
				m_activity_tracker.wait_stopped();
				m_activity_tracker.work_started();
				auto work_tracking_stopper = so_5::details::at_scope_exit(
						[this]{ m_activity_tracker.work_stopped(); } );

				// There is at least one demand to process.
				m_default_disp.handle_demand( demand );
			}
	}